

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aescrypt2.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *pcVar2;
  int *__s;
  uchar *input;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  mbedtls_md_info_t *md_info;
  FILE *__s_00;
  FILE *pFVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  undefined8 *__s_01;
  bool bVar14;
  uint n;
  uchar IV [16];
  mbedtls_md_context_t sha_ctx;
  uchar tmp [16];
  mbedtls_aes_context aes_ctx;
  uchar key [512];
  uchar buffer [1024];
  uint local_7dc;
  ulong local_7d8;
  ulong local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  FILE *local_7b8;
  mbedtls_md_context_t local_7b0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  char **local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  mbedtls_aes_context local_758;
  uchar local_638 [512];
  undefined8 local_438;
  undefined8 uStack_430;
  
  mbedtls_aes_init(&local_758);
  mbedtls_md_init(&local_7b0);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  iVar4 = mbedtls_md_setup(&local_7b0,md_info,1);
  if (iVar4 == 0) {
    if (argc == 5) {
      uVar5 = atoi(argv[1]);
      local_7c8 = 0;
      uStack_7c0 = 0;
      memset(local_638,0,0x200);
      local_798 = 0;
      uStack_790 = 0;
      local_788 = 0;
      uStack_780 = 0;
      __s_01 = &local_438;
      memset(__s_01,0,0x400);
      local_7d0 = CONCAT44(local_7d0._4_4_,uVar5);
      if (uVar5 < 2) {
        pcVar2 = argv[2];
        iVar4 = strcmp(pcVar2,argv[3]);
        if (iVar4 == 0) {
          main_cold_13();
        }
        else {
          ppcVar1 = argv + 2;
          local_7b8 = fopen(pcVar2,"rb");
          if (local_7b8 != (FILE *)0x0) {
            __s_00 = fopen(argv[3],"wb+");
            if (__s_00 == (FILE *)0x0) {
              main_cold_11();
              iVar4 = 0;
              __s_00 = (FILE *)0x0;
              pFVar6 = local_7b8;
              goto LAB_001035f3;
            }
            pFVar6 = fopen(argv[4],"rb");
            local_770 = ppcVar1;
            if (pFVar6 == (FILE *)0x0) {
              __s = (int *)argv[4];
              if (*__s == 0x3a786568) {
                uVar7 = 0;
                iVar4 = __isoc99_sscanf(__s + 1,"%02X",&local_7dc);
                if (0 < iVar4) {
                  lVar12 = (long)__s + 6;
                  uVar9 = 0;
                  do {
                    uVar7 = uVar9 + 1;
                    local_638[uVar9] = (uchar)local_7dc;
                    iVar4 = __isoc99_sscanf(lVar12,"%02X",&local_7dc);
                    if (iVar4 < 1) break;
                    lVar12 = lVar12 + 2;
                    bVar14 = uVar9 < 0x1ff;
                    uVar9 = uVar7;
                  } while (bVar14);
                }
              }
              else {
                sVar8 = strlen((char *)__s);
                uVar7 = 0x200;
                if (sVar8 < 0x200) {
                  uVar7 = sVar8;
                }
                memcpy(local_638,__s,uVar7);
              }
            }
            else {
              uVar7 = fread(local_638,1,0x200,pFVar6);
              fclose(pFVar6);
            }
            pcVar2 = argv[4];
            sVar8 = strlen(pcVar2);
            memset(pcVar2,0,sVar8);
            pFVar6 = local_7b8;
            iVar4 = fileno(local_7b8);
            uVar9 = lseek(iVar4,0,2);
            if ((long)uVar9 < 0) {
              perror("lseek");
            }
            else {
              local_7d8 = uVar9;
              iVar4 = fseek(pFVar6,0,0);
              uVar9 = local_7d8;
              if (iVar4 < 0) {
                main_cold_10();
              }
              else {
                if ((local_7d0 & 1) != 0) {
LAB_0010394b:
                  if ((long)local_7d8 < 0x30) {
                    main_cold_9();
                  }
                  else if ((local_7d8 & 0xf) == 0) {
                    sVar8 = fread(&local_438,1,0x10,pFVar6);
                    if (sVar8 == 0x10) {
                      local_7d0 = local_7d8 - 0x30;
                      local_7c8 = local_438;
                      uStack_7c0 = uStack_430;
                      uVar3 = uStack_7c0;
                      uStack_7c0._7_1_ = (byte)((ulong)uStack_430 >> 0x38);
                      uVar5 = (uint)uStack_7c0._7_1_;
                      local_788 = 0;
                      uStack_780 = 0;
                      local_798 = local_438;
                      uStack_790 = uStack_430;
                      iVar4 = 0x2000;
                      uStack_7c0 = uVar3;
                      do {
                        mbedtls_md_starts(&local_7b0);
                        mbedtls_md_update(&local_7b0,(uchar *)&local_798,0x20);
                        mbedtls_md_update(&local_7b0,local_638,uVar7);
                        mbedtls_md_finish(&local_7b0,(uchar *)&local_798);
                        iVar4 = iVar4 + -1;
                      } while (iVar4 != 0);
                      memset(local_638,0,0x200);
                      mbedtls_aes_setkey_dec(&local_758,(uchar *)&local_798,0x100);
                      mbedtls_md_hmac_starts(&local_7b0,(uchar *)&local_798,0x20);
                      pFVar6 = local_7b8;
                      if (local_7d8 != 0x30) {
                        local_7d8 = local_7d8 - 0x40;
                        uVar7 = 0;
                        do {
                          sVar8 = fread(&local_438,1,0x10,pFVar6);
                          if (sVar8 != 0x10) {
                            main_cold_6();
                            goto LAB_00103cb1;
                          }
                          local_768 = local_438;
                          uStack_760 = uStack_430;
                          mbedtls_md_hmac_update(&local_7b0,(uchar *)&local_438,0x10);
                          mbedtls_aes_crypt_ecb
                                    (&local_758,0,(uchar *)&local_438,(uchar *)&local_438);
                          lVar12 = 0;
                          do {
                            *(byte *)((long)&local_438 + lVar12) =
                                 *(byte *)((long)&local_438 + lVar12) ^
                                 *(byte *)((long)&local_7c8 + lVar12);
                            lVar12 = lVar12 + 1;
                          } while (lVar12 != 0x10);
                          uVar13 = 0x10;
                          if (uVar7 == local_7d8) {
                            uVar13 = uVar5 & 0xf;
                          }
                          local_7c8 = local_768;
                          uStack_7c0 = uStack_760;
                          sVar8 = (size_t)uVar13;
                          if ((char)(uVar5 & 0xf) == '\0') {
                            sVar8 = 0x10;
                          }
                          local_7dc = (uint)sVar8;
                          sVar8 = fwrite(&local_438,1,sVar8,__s_00);
                          if (sVar8 != local_7dc) {
                            fprintf(_stderr,"fwrite(%d bytes) failed\n");
                            goto LAB_00103cb1;
                          }
                          uVar7 = uVar7 + 0x10;
                        } while ((long)uVar7 < (long)local_7d0);
                      }
                      mbedtls_md_hmac_finish(&local_7b0,(uchar *)&local_798);
                      sVar8 = fread(&local_438,1,0x20,pFVar6);
                      if (sVar8 == 0x20) {
                        lVar12 = 0;
                        bVar11 = 0;
                        do {
                          bVar11 = bVar11 | *(byte *)((long)&local_438 + lVar12) ^
                                            *(byte *)((long)&local_798 + lVar12);
                          lVar12 = lVar12 + 1;
                        } while (lVar12 != 0x20);
                        if (bVar11 != 0) {
                          main_cold_8();
                        }
                      }
                      else {
                        main_cold_7();
                      }
                    }
                    else {
                      main_cold_5();
                    }
                  }
                  else {
                    main_cold_4();
                  }
LAB_00103cb1:
                  iVar4 = 0;
                  goto LAB_001035f3;
                }
                lVar12 = 0;
                do {
                  *(char *)__s_01 = (char)(local_7d8 >> ((byte)lVar12 & 0x3f));
                  __s_01 = (undefined8 *)((long)__s_01 + 1);
                  lVar12 = lVar12 + 8;
                } while (lVar12 != 0x40);
                input = (uchar *)*local_770;
                mbedtls_md_starts(&local_7b0);
                mbedtls_md_update(&local_7b0,(uchar *)&local_438,8);
                sVar8 = strlen((char *)input);
                mbedtls_md_update(&local_7b0,input,sVar8);
                mbedtls_md_finish(&local_7b0,(uchar *)&local_798);
                local_7c8 = local_798;
                uStack_7c0._7_1_ = (byte)((ulong)uStack_790 >> 0x38);
                uStack_7c0 = CONCAT17(uStack_7c0._7_1_ & 0xf0 | (byte)uVar9 & 0xf,(int7)uStack_790);
                sVar8 = fwrite(&local_7c8,1,0x10,__s_00);
                if (sVar8 == 0x10) {
                  local_788 = 0;
                  uStack_780 = 0;
                  local_798 = local_7c8;
                  uStack_790 = uStack_7c0;
                  iVar4 = 0x2000;
                  do {
                    mbedtls_md_starts(&local_7b0);
                    mbedtls_md_update(&local_7b0,(uchar *)&local_798,0x20);
                    mbedtls_md_update(&local_7b0,local_638,uVar7);
                    mbedtls_md_finish(&local_7b0,(uchar *)&local_798);
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                  memset(local_638,0,0x200);
                  mbedtls_aes_setkey_enc(&local_758,(uchar *)&local_798,0x100);
                  mbedtls_md_hmac_starts(&local_7b0,(uchar *)&local_798,0x20);
                  if (local_7d8 != 0) {
                    lVar12 = 0;
                    do {
                      uVar9 = local_7d8 - lVar12;
                      if (0xf < (long)uVar9) {
                        uVar9 = 0x10;
                      }
                      local_7dc = (uint)uVar9;
                      sVar8 = fread(&local_438,1,uVar9 & 0xffffffff,pFVar6);
                      if (sVar8 != local_7dc) {
                        fprintf(_stderr,"fread(%d bytes) failed\n");
                        goto LAB_00103cbf;
                      }
                      lVar10 = 0;
                      do {
                        *(byte *)((long)&local_438 + lVar10) =
                             *(byte *)((long)&local_438 + lVar10) ^
                             *(byte *)((long)&local_7c8 + lVar10);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 0x10);
                      mbedtls_aes_crypt_ecb(&local_758,1,(uchar *)&local_438,(uchar *)&local_438);
                      mbedtls_md_hmac_update(&local_7b0,(uchar *)&local_438,0x10);
                      sVar8 = fwrite(&local_438,1,0x10,__s_00);
                      if (sVar8 != 0x10) {
                        main_cold_2();
                        goto LAB_00103cbf;
                      }
                      local_7c8 = local_438;
                      uStack_7c0 = uStack_430;
                      lVar12 = lVar12 + 0x10;
                    } while (lVar12 < (long)local_7d8);
                  }
                  mbedtls_md_hmac_finish(&local_7b0,(uchar *)&local_798);
                  sVar8 = fwrite(&local_798,1,0x20,__s_00);
                  if (sVar8 == 0x20) {
                    if ((int)local_7d0 == 1) goto LAB_0010394b;
                  }
                  else {
                    main_cold_3();
                  }
                }
                else {
                  main_cold_1();
                }
              }
            }
LAB_00103cbf:
            iVar4 = 0;
            goto LAB_001035f3;
          }
          main_cold_12();
        }
      }
      else {
        main_cold_14();
      }
    }
    else {
      puts(
          "\n  aescrypt2 <mode> <input filename> <output filename> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: aescrypt2 0 file file.aes hex:E76B2413958B00E193\n"
          );
    }
    iVar4 = 0;
  }
  else {
    printf("  ! mbedtls_md_setup() returned -0x%04x\n");
  }
  __s_00 = (FILE *)0x0;
  pFVar6 = (FILE *)0x0;
LAB_001035f3:
  if (pFVar6 != (FILE *)0x0) {
    fclose(pFVar6);
  }
  if (__s_00 != (FILE *)0x0) {
    fclose(__s_00);
  }
  memset(&local_438,0,0x400);
  local_798 = 0;
  uStack_790 = 0;
  local_788 = 0;
  uStack_780 = 0;
  mbedtls_aes_free(&local_758);
  mbedtls_md_free(&local_7b0);
  return iVar4;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;

    unsigned int i, n;
    int mode, lastn;
    size_t keylen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[32];
    unsigned char buffer[1024];
    unsigned char diff;

    mbedtls_aes_context aes_ctx;
    mbedtls_md_context_t sha_ctx;

#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_aes_init( &aes_ctx );
    mbedtls_md_init( &sha_ctx );

    ret = mbedtls_md_setup( &sha_ctx, mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ), 1 );
    if( ret != 0 )
    {
        mbedtls_printf( "  ! mbedtls_md_setup() returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Parse the command-line arguments.
     */
    if( argc != 5 )
    {
        mbedtls_printf( USAGE );

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );
    memset(IV, 0, sizeof(IV));
    memset(key, 0, sizeof(key));
    memset(digest, 0, sizeof(digest));
    memset(buffer, 0, sizeof(buffer));

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalide operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the secret key and clean the command line.
     */
    if( ( fkey = fopen( argv[4], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[4], "hex:", 4 ) == 0 )
        {
            p = &argv[4][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[4] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[4], keylen );
        }
    }

    memset( argv[4], 0, strlen( argv[4] ) );

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = SHA-256( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &sha_ctx );
        mbedtls_md_update( &sha_ctx, buffer, 8 );
        mbedtls_md_update( &sha_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &sha_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * The last four bits in the IV are actually used
         * to store the file size modulo the AES block size.
         */
        lastn = (int)( filesize & 0x0F );

        IV[15] = (unsigned char)
            ( ( IV[15] & 0xF0 ) | lastn );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );
        mbedtls_aes_setkey_enc( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            n = ( filesize - offset > 16 ) ? 16 : (int)
                ( filesize - offset );

            if( fread( buffer, 1, n, fin ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", n );
                goto exit;
            }

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, buffer, buffer );
            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );

            if( fwrite( buffer, 1, 16, fout ) != 16 )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( IV, buffer, 16 );
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fwrite( digest, 1, 32, fout ) != 32 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        unsigned char tmp[16];

        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              AES Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    AES Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + 32   HMAC-SHA-256(ciphertext)
         */
        if( filesize < 48 )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( ( filesize & 0x0F ) != 0 )
        {
            mbedtls_fprintf( stderr, "File size not a multiple of 16.\n" );
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + 32 );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );
        lastn = IV[15] & 0x0F;

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );
        mbedtls_aes_setkey_dec( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            if( fread( buffer, 1, 16, fin ) != 16 )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( tmp, buffer, 16 );

            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );
            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_DECRYPT, buffer, buffer );

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            memcpy( IV, tmp, 16 );

            n = ( lastn > 0 && offset == filesize - 16 )
                ? lastn : 16;

            if( fwrite( buffer, 1, n, fout ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", n );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fread( buffer, 1, 32, fin ) != 32 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 32 );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < 32; i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_md_free( &sha_ctx );

    return( ret );
}